

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

void __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::ZEbasic_leakChecker
          (ZEbasic_leakChecker *this)

{
  key_type *pkVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  key_type *pkVar3;
  ctorsAndDtors *s;
  pointer pcVar4;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> set;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> local_40
  ;
  
  (this->super_ZEValidationEntryPoints)._vptr_ZEValidationEntryPoints =
       (_func_int **)&PTR_zeInitPrologue_001d4188;
  (this->counts)._M_h._M_buckets = &(this->counts)._M_h._M_single_bucket;
  (this->counts)._M_h._M_bucket_count = 1;
  (this->counts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->counts)._M_h._M_element_count = 0;
  (this->counts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->counts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->counts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  createDestroySet();
  for (pcVar4 = local_40.
                super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 != local_40.
                super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
                ._M_impl.super__Vector_impl_data._M_finish; pcVar4 = pcVar4 + 1) {
    pkVar1 = (pcVar4->ctors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pkVar3 = (pcVar4->ctors).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pkVar3 != pkVar1; pkVar3 = pkVar3 + 1)
    {
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->counts,pkVar3);
      LOCK();
      (pmVar2->super___atomic_base<long>)._M_i = 0;
      UNLOCK();
    }
    pkVar1 = (pcVar4->dtors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pkVar3 = (pcVar4->dtors).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pkVar3 != pkVar1; pkVar3 = pkVar3 + 1)
    {
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->counts,pkVar3);
      LOCK();
      (pmVar2->super___atomic_base<long>)._M_i = 0;
      UNLOCK();
    }
  }
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  ~vector(&local_40);
  return;
}

Assistant:

basic_leakChecker::ZEbasic_leakChecker::ZEbasic_leakChecker() {
        // initialize counts for all functions that should be tracked
        auto set = createDestroySet();
        for (const auto &s : set) {
            for (auto &name : s.ctors) {
                counts[name] = 0;
            }
            for (auto &name : s.dtors) {
                counts[name] = 0;
            }
        }
    }